

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_stringbuilder.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::number::impl::NumberStringBuilder::toDebugString
          (UnicodeString *__return_storage_ptr__,NumberStringBuilder *this)

{
  char16_t srcChar;
  ValueOrHeapArray<UNumberFormatFields> *pVVar1;
  long lVar2;
  ConstChar16Ptr local_b8;
  ConstChar16Ptr local_b0;
  ConstChar16Ptr local_a8 [3];
  char16_t *local_90;
  char16_t *local_80;
  UnicodeString local_70;
  
  (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003edbf0;
  (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
  local_a8[0].p_ = L"<NumberStringBuilder [";
  UnicodeString::append(__return_storage_ptr__,local_a8,-1);
  local_80 = local_a8[0].p_;
  toUnicodeString(&local_70,this);
  UnicodeString::append(__return_storage_ptr__,&local_70);
  UnicodeString::~UnicodeString(&local_70);
  local_b0.p_ = L"] [";
  UnicodeString::append(__return_storage_ptr__,&local_b0,-1);
  local_90 = local_b0.p_;
  lVar2 = 0;
  do {
    if (this->fLength <= (int)lVar2) {
      local_b8.p_ = L"]>";
      UnicodeString::append(__return_storage_ptr__,&local_b8,-1);
      return __return_storage_ptr__;
    }
    pVVar1 = &this->fFields;
    if (this->fUsingHeap != false) {
      pVVar1 = (ValueOrHeapArray<UNumberFormatFields> *)(this->fFields).heap.ptr;
    }
    switch(pVVar1->value[this->fZero + lVar2]) {
    case UNUM_INTEGER_FIELD:
      srcChar = L'i';
      break;
    case UNUM_FRACTION_FIELD:
      srcChar = L'f';
      break;
    case UNUM_DECIMAL_SEPARATOR_FIELD:
      srcChar = L'.';
      break;
    case UNUM_EXPONENT_SYMBOL_FIELD:
      srcChar = L'E';
      break;
    case UNUM_EXPONENT_SIGN_FIELD:
      srcChar = L'+';
      break;
    case UNUM_EXPONENT_FIELD:
      srcChar = L'e';
      break;
    case UNUM_GROUPING_SEPARATOR_FIELD:
      srcChar = L',';
      break;
    case UNUM_CURRENCY_FIELD:
      srcChar = L'$';
      break;
    case UNUM_PERCENT_FIELD:
      srcChar = L'%';
      break;
    case UNUM_PERMILL_FIELD:
      srcChar = L'‰';
      break;
    case UNUM_SIGN_FIELD:
      srcChar = L'-';
      break;
    case UNUM_FIELD_COUNT:
      UnicodeString::append(__return_storage_ptr__,L'n');
      goto LAB_00270fc9;
    default:
      srcChar = L'?';
    }
    UnicodeString::append(__return_storage_ptr__,srcChar);
LAB_00270fc9:
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

UnicodeString NumberStringBuilder::toDebugString() const {
    UnicodeString sb;
    sb.append(u"<NumberStringBuilder [", -1);
    sb.append(toUnicodeString());
    sb.append(u"] [", -1);
    for (int i = 0; i < fLength; i++) {
        if (fieldAt(i) == UNUM_FIELD_COUNT) {
            sb.append(u'n');
        } else {
            char16_t c;
            switch (fieldAt(i)) {
                case UNUM_SIGN_FIELD:
                    c = u'-';
                    break;
                case UNUM_INTEGER_FIELD:
                    c = u'i';
                    break;
                case UNUM_FRACTION_FIELD:
                    c = u'f';
                    break;
                case UNUM_EXPONENT_FIELD:
                    c = u'e';
                    break;
                case UNUM_EXPONENT_SIGN_FIELD:
                    c = u'+';
                    break;
                case UNUM_EXPONENT_SYMBOL_FIELD:
                    c = u'E';
                    break;
                case UNUM_DECIMAL_SEPARATOR_FIELD:
                    c = u'.';
                    break;
                case UNUM_GROUPING_SEPARATOR_FIELD:
                    c = u',';
                    break;
                case UNUM_PERCENT_FIELD:
                    c = u'%';
                    break;
                case UNUM_PERMILL_FIELD:
                    c = u'‰';
                    break;
                case UNUM_CURRENCY_FIELD:
                    c = u'$';
                    break;
                default:
                    c = u'?';
                    break;
            }
            sb.append(c);
        }
    }
    sb.append(u"]>", -1);
    return sb;
}